

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleFile.cpp
# Opt level: O1

QString * __thiscall
ModuleFile::crashSave(QString *__return_storage_ptr__,ModuleFile *this,Module *mod)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  Data *pDVar3;
  FormatError FVar4;
  Module *this_00;
  QString copyPath;
  QFileInfo info;
  ofstream stream;
  QDir local_280 [8];
  QString local_278;
  QString local_258;
  QArrayData *local_240;
  char16_t *local_238;
  QArrayData local_230;
  undefined8 local_220;
  undefined1 local_218 [8];
  char16_t *local_210;
  qsizetype qStack_208;
  int aiStack_1f8 [54];
  ios_base local_120 [264];
  
  local_278.d.d = (Data *)0x0;
  local_278.d.ptr = (char16_t *)0x0;
  local_278.d.size = 0;
  if ((this->mFilepath).d.size == 0) {
    QString::operator=(&local_278,&this->mFilename);
  }
  else {
    QFileInfo::QFileInfo((QFileInfo *)&local_258,&this->mFilepath);
    QFileInfo::dir();
    QFileInfo::baseName();
    QDir::filePath((QString *)local_218);
    qVar2 = local_278.d.size;
    pcVar1 = local_278.d.ptr;
    pDVar3 = local_278.d.d;
    local_278.d.d = (Data *)local_218;
    local_218 = (undefined1  [8])pDVar3;
    local_278.d.ptr = local_210;
    local_278.d.size = qStack_208;
    local_210 = pcVar1;
    qStack_208 = qVar2;
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,8);
      }
    }
    if (local_240 != (QArrayData *)0x0) {
      LOCK();
      (local_240->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_240->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_240->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_240,2,8);
      }
    }
    QDir::~QDir(local_280);
    QFileInfo::~QFileInfo((QFileInfo *)&local_258);
  }
  local_240 = (QArrayData *)0x0;
  local_238 = L".crash-%1.tbm";
  local_230.ref_._q_value.super___atomic_base<int>._M_i = (Type)0xd;
  local_230.flags.i = 0;
  QDateTime::currentDateTime();
  QCalendar::QCalendar((QCalendar *)&local_220);
  QDateTime::toString(&local_258,local_280,0x13,L"yyyy.mm.ddThh.mm.ss",local_220);
  QString::arg((QString *)local_218,(int)&local_240,(QChar)(char16_t)&local_258);
  QString::append(&local_278);
  if (local_218 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_218)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_218)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_218)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_218,2,8);
    }
  }
  if (&(local_258.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_258.d.d)->super_QArrayData,2,8);
    }
  }
  QDateTime::~QDateTime((QDateTime *)local_280);
  if (local_240 != (QArrayData *)0x0) {
    LOCK();
    (local_240->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_240->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_240->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_240,2,8);
    }
  }
  QString::toUtf8_helper(&local_258);
  if (local_258.d.ptr == (char16_t *)0x0) {
    local_258.d.ptr = (char16_t *)&QByteArray::_empty;
  }
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,local_258.d.ptr,local_258.d.size + (long)local_258.d.ptr);
  if (&(local_258.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_258.d.d)->super_QArrayData,1,8);
    }
  }
  std::ofstream::ofstream(local_218,(string *)&local_240,_S_out|_S_bin);
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230._0_8_ + 1);
  }
  if (*(int *)((long)aiStack_1f8 + ((QArrayData *)((long)local_218 + -0x20))->alloc) == 0) {
    Module::beginSave(mod);
    this_00 = Module::data(mod);
    FVar4 = trackerboy::Module::serialize(this_00,(ostream *)local_218);
    if (FVar4 == none) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      (__return_storage_ptr__->d).d = local_278.d.d;
      local_278.d.d = (Data *)0x0;
      pcVar1 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).ptr = local_278.d.ptr;
      qVar2 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_278.d.size;
      local_278.d.ptr = pcVar1;
      local_278.d.size = qVar2;
      goto LAB_0014d8b0;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0014d8b0:
  local_218 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_218 + _VTT[-2].super_QArrayData.alloc) = __QObject;
  std::filebuf::~filebuf((filebuf *)&local_210);
  std::ios_base::~ios_base(local_120);
  if (&(local_278.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_278.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_278.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_278.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_278.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString ModuleFile::crashSave(Module &mod) {
    // attempt to save a copy of the module
    // the copy is the same path of the module, but with .crash-%1 appended
    // where %1 is an ISO 8601 timestamp
    QString copyPath;
    if (hasFile()) {
        QFileInfo info(mFilepath);
        copyPath = info.dir().filePath(info.baseName());
    } else {
        copyPath = mFilename;
    }
    copyPath.append(QStringLiteral(".crash-%1.tbm").arg(
        QDateTime::currentDateTime().toString(QStringLiteral("yyyy.mm.ddThh.mm.ss"))
    ));

    // This approach uses the same directory as the module file, which will
    // fail if we don't have write permissions in this directory. Might be worth
    // checking beforehand and use a fall-back location if this is the case
    // (perhaps the user's home directory)

    // for modules without a path, the file gets saved in the current directory

    // in the case of collisions, the file will be overwritten. Should be
    // extremely unlikely due to the timestamp being added to the filename

    std::ofstream stream(copyPath.toStdString(), std::ios::binary | std::ios::out);
    if (stream.good()) {
        mod.beginSave();
        if (mod.data().serialize(stream) == trackerboy::FormatError::none) {
            // success! return the path of the saved file
            return copyPath;
        }
    }

    // we either could not open the stream or an error occurred during serialization
    return {};
}